

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

void __thiscall Rml::DataViewIf::DataViewIf(DataViewIf *this,Element *element)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint7 uStack_1f;
  undefined8 uStack_18;
  
  DataView::DataView((DataView *)this,element,0);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_0032e650;
  paVar1 = &(this->super_DataViewCommon).modifier.field_2;
  (this->super_DataViewCommon).modifier._M_dataplus._M_p = (pointer)paVar1;
  paVar1->_M_allocated_capacity = (ulong)uStack_1f << 8;
  *(undefined8 *)((long)&(this->super_DataViewCommon).modifier.field_2 + 8) = uStack_18;
  (this->super_DataViewCommon).modifier._M_string_length = 0;
  (this->super_DataViewCommon).expression._M_t.
  super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
  super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl = (DataExpression *)0x0;
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_0032e810;
  return;
}

Assistant:

DataViewIf::DataViewIf(Element* element) : DataViewCommon(element) {}